

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateStubDefinition
          (ServiceGenerator *this,Printer *printer)

{
  Formatter format;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->vars_)._M_t);
  Formatter::operator()<>
            (&format,"class $dllexport_decl $$classname$_Stub : public $classname$ {\n public:\n");
  io::Printer::Indent(printer);
  Formatter::operator()<>
            (&format,
             "$classname$_Stub(::$proto_ns$::RpcChannel* channel);\n$classname$_Stub(::$proto_ns$::RpcChannel* channel,\n                 ::$proto_ns$::Service::ChannelOwnership ownership);\n~$classname$_Stub();\n\ninline ::$proto_ns$::RpcChannel* channel() { return channel_; }\n\n// implements $classname$ ------------------------------------------\n\n"
            );
  GenerateMethodSignatures(this,NON_VIRTUAL,printer);
  io::Printer::Outdent(printer);
  Formatter::operator()<>
            (&format,
             " private:\n  ::$proto_ns$::RpcChannel* channel_;\n  bool owns_channel_;\n  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$_Stub);\n};\n\n"
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void ServiceGenerator::GenerateStubDefinition(io::Printer* printer) {
  Formatter format(printer, vars_);
  format(
      "class $dllexport_decl $$classname$_Stub : public $classname$ {\n"
      " public:\n");

  printer->Indent();

  format(
      "$classname$_Stub(::$proto_ns$::RpcChannel* channel);\n"
      "$classname$_Stub(::$proto_ns$::RpcChannel* channel,\n"
      "                 ::$proto_ns$::Service::ChannelOwnership ownership);\n"
      "~$classname$_Stub();\n"
      "\n"
      "inline ::$proto_ns$::RpcChannel* channel() { return channel_; }\n"
      "\n"
      "// implements $classname$ ------------------------------------------\n"
      "\n");

  GenerateMethodSignatures(NON_VIRTUAL, printer);

  printer->Outdent();
  format(
      " private:\n"
      "  ::$proto_ns$::RpcChannel* channel_;\n"
      "  bool owns_channel_;\n"
      "  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$_Stub);\n"
      "};\n"
      "\n");
}